

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::sortLinked(Earcut<unsigned_int> *this,Node *list)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  int iVar8;
  int iVar9;
  Node *pNVar10;
  int iVar11;
  Node *pNVar12;
  
  if (list == (Node *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/mapbox/earcut/earcut.hpp"
                  ,0x22c,
                  "typename Earcut<N>::Node *mapbox::detail::Earcut<>::sortLinked(Node *) [N = unsigned int]"
                 );
  }
  iVar2 = 1;
  do {
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    pNVar6 = (Node *)0x0;
    pNVar7 = (Node *)0x0;
    uVar4 = 0;
LAB_002c93c8:
    if (list != (Node *)0x0) {
      uVar4 = uVar4 + 1;
      iVar8 = 0;
      pNVar12 = list;
      do {
        pNVar10 = list;
        iVar9 = iVar3;
        iVar11 = iVar2;
        if (iVar3 == iVar8) goto LAB_002c93f5;
        iVar8 = iVar8 + 1;
        pNVar12 = pNVar12->nextZ;
      } while (pNVar12 != (Node *)0x0);
      pNVar12 = (Node *)0x0;
      iVar9 = iVar8;
LAB_002c93f5:
      do {
        list = pNVar12;
        if (iVar9 < 1) {
          if ((iVar11 < 1) || (list == (Node *)0x0)) goto LAB_002c93c8;
          if (iVar9 != 0) goto LAB_002c9409;
          pNVar12 = list->nextZ;
          iVar9 = 0;
LAB_002c943f:
          iVar11 = iVar11 + -1;
          pNVar5 = pNVar10;
          pNVar10 = list;
        }
        else {
LAB_002c9409:
          if (((iVar11 != 0) && (list != (Node *)0x0)) && (list->z < pNVar10->z)) {
            pNVar12 = list->nextZ;
            goto LAB_002c943f;
          }
          pNVar5 = pNVar10->nextZ;
          iVar9 = iVar9 + -1;
          pNVar12 = list;
        }
        pNVar1 = pNVar10;
        if (pNVar7 != (Node *)0x0) {
          pNVar7->nextZ = pNVar10;
          pNVar1 = pNVar6;
        }
        pNVar6 = pNVar1;
        pNVar10->prevZ = pNVar7;
        pNVar7 = pNVar10;
        pNVar10 = pNVar5;
      } while( true );
    }
    pNVar7->nextZ = (Node *)0x0;
    iVar2 = iVar2 * 2;
    list = pNVar6;
    if (uVar4 < 2) {
      return pNVar6;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::sortLinked(Node* list) {
    assert(list);
    Node* p;
    Node* q;
    Node* e;
    Node* tail;
    int i, numMerges, pSize, qSize;
    int inSize = 1;

    for (;;) {
        p = list;
        list = nullptr;
        tail = nullptr;
        numMerges = 0;

        while (p) {
            numMerges++;
            q = p;
            pSize = 0;
            for (i = 0; i < inSize; i++) {
                pSize++;
                q = q->nextZ;
                if (!q) break;
            }

            qSize = inSize;

            while (pSize > 0 || (qSize > 0 && q)) {

                if (pSize == 0) {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                } else if (qSize == 0 || !q) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else if (p->z <= q->z) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                }

                if (tail) tail->nextZ = e;
                else list = e;

                e->prevZ = tail;
                tail = e;
            }

            p = q;
        }

        tail->nextZ = nullptr;

        if (numMerges <= 1) return list;

        inSize *= 2;
    }
}